

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

int absl::lts_20250127::base_internal::LLA_SkiplistLevels(size_t size,size_t base,uint32_t *random)

{
  int iVar1;
  ulong uVar2;
  int local_40;
  char *absl_raw_log_internal_basename;
  int level;
  size_t max_fit;
  uint32_t *random_local;
  size_t base_local;
  size_t size_local;
  
  uVar2 = size - 0x28 >> 3;
  iVar1 = IntLog2(size,base);
  if (random == (uint32_t *)0x0) {
    local_40 = 1;
  }
  else {
    local_40 = Random(random);
  }
  absl_raw_log_internal_basename._4_4_ = iVar1 + local_40;
  if (uVar2 < (ulong)(long)absl_raw_log_internal_basename._4_4_) {
    absl_raw_log_internal_basename._4_4_ = (int)uVar2;
  }
  if (0x1d < absl_raw_log_internal_basename._4_4_) {
    absl_raw_log_internal_basename._4_4_ = 0x1d;
  }
  if (0 < absl_raw_log_internal_basename._4_4_) {
    return absl_raw_log_internal_basename._4_4_;
  }
  raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x94,"Check %s failed: %s","level >= 1",
             "block not big enough for even one level");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                ,0x94,"int absl::base_internal::LLA_SkiplistLevels(size_t, size_t, uint32_t *)");
}

Assistant:

static int LLA_SkiplistLevels(size_t size, size_t base, uint32_t *random) {
  // max_fit is the maximum number of levels that will fit in a node for the
  // given size.   We can't return more than max_fit, no matter what the
  // random number generator says.
  size_t max_fit = (size - offsetof(AllocList, next)) / sizeof(AllocList *);
  int level = IntLog2(size, base) + (random != nullptr ? Random(random) : 1);
  if (static_cast<size_t>(level) > max_fit) level = static_cast<int>(max_fit);
  if (level > kMaxLevel - 1) level = kMaxLevel - 1;
  ABSL_RAW_CHECK(level >= 1, "block not big enough for even one level");
  return level;
}